

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O2

void __thiscall
ConfidentialTxIn_AddPeginWitnessStack_Test::TestBody
          (ConfidentialTxIn_AddPeginWitnessStack_Test *this)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  AssertionResult gtest_ar;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_268;
  AssertionResult gtest_ar_1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_238;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_220;
  ByteData exp_data;
  ScriptWitness exp_pegin_witness;
  ScriptWitness exp_witness_stack;
  ScriptWitness local_1b0;
  ConfidentialTxIn txin;
  
  GetExpectWitnessStack();
  GetExpectPeginWitnessStack();
  std::__cxx11::string::string((string *)&txin,"1234567890",(allocator *)&gtest_ar);
  cfd::core::ByteData::ByteData(&exp_data,(string *)&txin);
  std::__cxx11::string::~string((string *)&txin);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            (&txin,&exp_txid,2,0xfffffffe,&exp_script,&exp_witness_stack,&exp_blinding_nonce,
             &exp_asset_entropy,&exp_issuance_amount,&exp_inflation_keys,
             &exp_issuance_amount_rangeproof,&exp_inflation_keys_rangeproof,&exp_pegin_witness);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTxIn::AddPeginWitnessStack((ByteData *)&local_1b0);
      cfd::core::ScriptWitness::~ScriptWitness(&local_1b0);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xae,
               "Expected: (txin.AddPeginWitnessStack(exp_data)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  local_268._M_impl.super__Vector_impl_data._M_start._0_4_ =
       cfd::core::ScriptWitness::GetWitnessNum();
  local_238.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = cfd::core::ScriptWitness::GetWitnessNum();
  local_238.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ =
       (int)local_238.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
            _M_impl.super__Vector_impl_data._M_start + 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin.GetPeginWitnessStackNum()",
             "exp_pegin_witness.GetWitnessNum() + 1",(uint *)&local_268,(uint *)&local_238);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_268);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_268);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ScriptWitness::ScriptWitness((ScriptWitness *)&gtest_ar,&txin.pegin_witness_);
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&gtest_ar);
  cfd::core::ScriptWitness::GetWitness();
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)local_220.
                             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_220.
                            super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1) {
    cfd::core::ByteData::GetHex_abi_cxx11_();
    pcVar2 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_1,"test_peg_vector[idx].GetHex().c_str()",
               "exp_peg_vector[idx].GetHex().c_str()",pcVar2,
               (char *)CONCAT44(local_268._M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_268._M_impl.super__Vector_impl_data._M_start._0_4_));
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      pcVar2 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0xb6,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar2 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"test_peg_vector[target_index].GetHex().c_str()",
             "exp_data.GetHex().c_str()",pcVar2,
             (char *)CONCAT44(local_268._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_268._M_impl.super__Vector_impl_data._M_start._0_4_));
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xb9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::ConfidentialTxIn::GetWitnessHash();
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"txin.GetWitnessHash().GetHex().c_str()",
             "\"d4fa3782068f8f1cef563520691eafbc883d1caf1d928012462644c7148cf1d5\"",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             "d4fa3782068f8f1cef563520691eafbc883d1caf1d928012462644c7148cf1d5");
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_268);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xbb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_220);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_238);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&txin);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
  cfd::core::ScriptWitness::~ScriptWitness(&exp_pegin_witness);
  cfd::core::ScriptWitness::~ScriptWitness(&exp_witness_stack);
  return;
}

Assistant:

TEST(ConfidentialTxIn, AddPeginWitnessStack) {
  ScriptWitness exp_witness_stack = GetExpectWitnessStack();
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();
  const ByteData exp_data("1234567890");
  uint32_t target_index = 6;

  ConfidentialTxIn txin(exp_txid, exp_index, exp_sequence, exp_script,
      exp_witness_stack, exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof, exp_pegin_witness);
  EXPECT_NO_THROW((txin.AddPeginWitnessStack(exp_data)));
  EXPECT_EQ(txin.GetPeginWitnessStackNum(),
      exp_pegin_witness.GetWitnessNum() + 1);
  const std::vector<ByteData>& test_peg_vector = txin.GetPeginWitness()
      .GetWitness();
  const std::vector<ByteData>& exp_peg_vector = exp_pegin_witness.GetWitness();
  for (size_t idx = 0; idx < exp_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
        exp_peg_vector[idx].GetHex().c_str());
  }
  EXPECT_STREQ(test_peg_vector[target_index].GetHex().c_str(),
      exp_data.GetHex().c_str());
  EXPECT_STREQ(txin.GetWitnessHash().GetHex().c_str(), 
    "d4fa3782068f8f1cef563520691eafbc883d1caf1d928012462644c7148cf1d5");
}